

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  long in_RSI;
  Totals *in_RDI;
  
  Counts::operator+=(&in_RDI->assertions,(Counts *)(in_RSI + 8));
  Counts::operator+=(&in_RDI->testCases,(Counts *)(in_RSI + 0x20));
  return in_RDI;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }